

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeObjectiveFunction.cpp
# Opt level: O0

DynamicVector<double,_std::allocator<double>_> * __thiscall
OpenMD::FluctuatingChargeObjectiveFunction::setInitialCoords
          (FluctuatingChargeObjectiveFunction *this)

{
  reference pvVar1;
  long in_RSI;
  DynamicVector<double,_std::allocator<double>_> *in_RDI;
  int index;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  DynamicVector<double,_std::allocator<double>_> *initCoords;
  size_type in_stack_ffffffffffffff58;
  Molecule *in_stack_ffffffffffffff60;
  iterator *in_stack_ffffffffffffff78;
  SimInfo *in_stack_ffffffffffffff80;
  SimInfo *local_30;
  Molecule *local_28;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18 [3];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_18);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_20);
  *(undefined4 *)(in_RSI + 0x28) = 0;
  local_28 = SimInfo::beginMolecule
                       (in_stack_ffffffffffffff80,(MoleculeIterator *)in_stack_ffffffffffffff78);
  while (local_28 != (Molecule *)0x0) {
    local_30 = (SimInfo *)
               Molecule::beginFluctuatingCharge
                         ((Molecule *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    while (local_30 != (SimInfo *)0x0) {
      *(int *)(in_RSI + 0x28) = *(int *)(in_RSI + 0x28) + 1;
      local_30 = (SimInfo *)
                 Molecule::nextFluctuatingCharge
                           ((Molecule *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    local_28 = SimInfo::nextMolecule
                         (in_stack_ffffffffffffff80,(MoleculeIterator *)in_stack_ffffffffffffff78);
  }
  std::allocator<double>::allocator((allocator<double> *)0x38174b);
  DynamicVector<double,_std::allocator<double>_>::DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58,(allocator_type *)0x38175f);
  std::allocator<double>::~allocator((allocator<double> *)0x38176b);
  local_28 = SimInfo::beginMolecule
                       (in_stack_ffffffffffffff80,(MoleculeIterator *)in_stack_ffffffffffffff78);
  while (local_28 != (Molecule *)0x0) {
    in_stack_ffffffffffffff80 =
         (SimInfo *)
         Molecule::beginFluctuatingCharge
                   ((Molecule *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_30 = in_stack_ffffffffffffff80;
    while (local_30 != (SimInfo *)0x0) {
      in_stack_ffffffffffffff78 =
           (iterator *)StuntDouble::getFlucQPos((StuntDouble *)in_stack_ffffffffffffff60);
      pvVar1 = DynamicVector<double,_std::allocator<double>_>::operator[]
                         ((DynamicVector<double,_std::allocator<double>_> *)
                          in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      *pvVar1 = (value_type)in_stack_ffffffffffffff78;
      local_30 = (SimInfo *)
                 Molecule::nextFluctuatingCharge
                           ((Molecule *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    in_stack_ffffffffffffff60 =
         SimInfo::nextMolecule
                   (in_stack_ffffffffffffff80,(MoleculeIterator *)in_stack_ffffffffffffff78);
    local_28 = in_stack_ffffffffffffff60;
  }
  return in_RDI;
}

Assistant:

DynamicVector<RealType>
      FluctuatingChargeObjectiveFunction::setInitialCoords() {
#ifdef IS_MPI
    MPI_Comm_size(MPI_COMM_WORLD, &nproc_);
    MPI_Comm_rank(MPI_COMM_WORLD, &myrank_);
    std::vector<int> flucqOnProc_(nproc_, 0);

    displacements_.clear();
    displacements_.resize(nproc_, 0);
#endif

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;

    nFlucQ_ = 0;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        nFlucQ_++;
      }
    }

#ifdef IS_MPI
    MPI_Allgather(&nFlucQ_, 1, MPI_INT, &flucqOnProc_[0], 1, MPI_INT,
                  MPI_COMM_WORLD);

    nFlucQ_ = 0;
    for (int iproc = 0; iproc < nproc_; iproc++) {
      nFlucQ_ += flucqOnProc_[iproc];
    }

    displacements_[0] = 0;
    for (int iproc = 1; iproc < nproc_; iproc++) {
      displacements_[iproc] =
          displacements_[iproc - 1] + flucqOnProc_[iproc - 1];
    }
#endif

    DynamicVector<RealType> initCoords(nFlucQ_);

    int index;
#ifdef IS_MPI
    index = displacements_[myrank_];
#else
    index = 0;
#endif

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        initCoords[index++] = atom->getFlucQPos();
      }
    }

#ifdef IS_MPI
    MPI_Allgatherv(MPI_IN_PLACE, 0, MPI_DATATYPE_NULL, &initCoords[0],
                   &flucqOnProc_[0], &displacements_[0], MPI_REALTYPE,
                   MPI_COMM_WORLD);
#endif

    return initCoords;
  }